

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_error.h
# Opt level: O0

string * __thiscall jsonnet::internal::StaticError::toString_abi_cxx11_(StaticError *this)

{
  bool bVar1;
  ostream *poVar2;
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  LocationRange *in_stack_fffffffffffffe28;
  ostream *in_stack_fffffffffffffe30;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  bVar1 = LocationRange::isSet((LocationRange *)0x1dd945);
  if (bVar1) {
    poVar2 = internal::operator<<(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    std::operator<<(poVar2,":");
  }
  poVar2 = std::operator<<(local_188," ");
  std::operator<<(poVar2,(string *)(in_RSI + 0x40));
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string toString() const
    {
        std::stringstream ss;
        if (location.isSet()) {
            ss << location << ":";
        }
        ss << " " << msg;
        return ss.str();
    }